

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_lex.c
# Opt level: O3

void easm_restart(FILE *input_file,yyscan_t yyscanner)

{
  undefined1 *puVar1;
  YY_BUFFER_STATE pyVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = *(long *)((long)yyscanner + 0x38);
  if ((lVar3 == 0) || (lVar4 = *(long *)((long)yyscanner + 0x28), *(long *)(lVar3 + lVar4 * 8) == 0)
     ) {
    easm_ensure_buffer_stack(yyscanner);
    pyVar2 = easm__create_buffer(*(FILE **)((long)yyscanner + 0x18),0x4000,yyscanner);
    lVar4 = *(long *)((long)yyscanner + 0x28);
    *(YY_BUFFER_STATE *)(*(long *)((long)yyscanner + 0x38) + lVar4 * 8) = pyVar2;
    lVar3 = *(long *)((long)yyscanner + 0x38);
    if (lVar3 == 0) {
      pyVar2 = (YY_BUFFER_STATE)0x0;
      goto LAB_0024d7d4;
    }
  }
  pyVar2 = *(YY_BUFFER_STATE *)(lVar3 + lVar4 * 8);
LAB_0024d7d4:
  easm__init_buffer(pyVar2,input_file,yyscanner);
  lVar3 = *(long *)(*(long *)((long)yyscanner + 0x38) + *(long *)((long)yyscanner + 0x28) * 8);
  *(undefined4 *)((long)yyscanner + 0x44) = *(undefined4 *)(lVar3 + 0x1c);
  puVar1 = *(undefined1 **)(lVar3 + 0x10);
  *(undefined1 **)((long)yyscanner + 0x50) = puVar1;
  *(undefined1 **)((long)yyscanner + 0x90) = puVar1;
  *(undefined8 *)((long)yyscanner + 0x18) =
       **(undefined8 **)(*(long *)((long)yyscanner + 0x38) + *(long *)((long)yyscanner + 0x28) * 8);
  *(undefined1 *)((long)yyscanner + 0x40) = *puVar1;
  return;
}

Assistant:

void yyrestart  (FILE * input_file , yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	if ( ! YY_CURRENT_BUFFER ){
        yyensure_buffer_stack (yyscanner);
		YY_CURRENT_BUFFER_LVALUE =
            yy_create_buffer( yyin, YY_BUF_SIZE , yyscanner);
	}

	yy_init_buffer( YY_CURRENT_BUFFER, input_file , yyscanner);
	yy_load_buffer_state( yyscanner );
}